

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

variable_order_t * __thiscall
merlin::graphical_model::order
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  double dVar1;
  unsigned_long uVar2;
  size_t i;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  ulong uVar7;
  iterator iVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  long lVar13;
  _Rb_tree_node_base *p_Var14;
  iterator fi;
  pointer puVar15;
  long lVar16;
  variable_order_t maxOrd;
  variable_set sumVars;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  reverse;
  variable_set fix;
  score_map_t scores;
  ulong local_160;
  variable_set local_158;
  variable_set local_118;
  pair<double,_unsigned_long> local_d8;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_c8;
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  local_b0;
  variable_set local_98;
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (__return_storage_ptr__,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (ord_type.t_ == Random) {
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    if ((this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar15 = (pointer)0x0;
      do {
        puVar6 = (pointer)((long)puVar15 + 0x3f);
        if (-1 < (long)puVar15) {
          puVar6 = puVar15;
        }
        local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar15;
        if (((var_types->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)puVar6 >> 6) +
              (ulong)(((ulong)puVar15 & 0x800000000000003f) < 0x8000000000000001) +
              0xffffffffffffffff] >> ((ulong)puVar15 & 0x3f) & 1) == 0) {
          if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_118.m_v,
                       (iterator)
                       local_118.m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
          }
          else {
            *local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish = (unsigned_long)puVar15;
            local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish ==
                 local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_158.m_v,
                     (iterator)
                     local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
        }
        else {
          *local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)puVar15;
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        puVar15 = (pointer)((long)puVar15 + 1);
      } while (puVar15 < (pointer)((long)(this->m_vadj).
                                         super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_vadj).
                                         super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    puVar6 = local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
    puVar15 = local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start + 1 !=
        local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      lVar16 = 8;
      do {
        iVar4 = rand();
        lVar12 = (long)iVar4 % ((lVar16 >> 3) + 1);
        if (lVar16 != lVar12 * 8) {
          uVar2 = *(unsigned_long *)((long)puVar15 + lVar16);
          *(unsigned_long *)((long)puVar15 + lVar16) = puVar15[lVar12];
          puVar15[lVar12] = uVar2;
        }
        lVar12 = lVar16 + 8;
        lVar16 = lVar16 + 8;
      } while ((unsigned_long *)((long)puVar15 + lVar12) != puVar6);
    }
    puVar6 = local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
    puVar15 = local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start + 1 !=
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      lVar16 = 8;
      do {
        iVar4 = rand();
        lVar12 = (long)iVar4 % ((lVar16 >> 3) + 1);
        if (lVar16 != lVar12 * 8) {
          uVar2 = *(unsigned_long *)((long)puVar15 + lVar16);
          *(unsigned_long *)((long)puVar15 + lVar16) = puVar15[lVar12];
          puVar15[lVar12] = uVar2;
        }
        lVar12 = lVar16 + 8;
        lVar16 = lVar16 + 8;
      } while ((unsigned_long *)((long)puVar15 + lVar12) != puVar6);
    }
    if ((long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      lVar16 = 0;
    }
    else {
      lVar12 = (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      puVar15 = (__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        puVar15[lVar16] =
             local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar16);
    }
    if ((long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar12 = (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      puVar15 = (__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        puVar15[lVar16 + lVar13] =
             local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
    }
    if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_158.m_v.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_118.m_v.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    mrf(&local_c8,this);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::vector(&local_b0,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_118);
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.m_d = (vsize *)0x0;
    if ((this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var9 = (_Base_ptr)0x0;
      do {
        p_Var10 = (_Base_ptr)((long)&p_Var9[1]._M_right + 7);
        if (-1 < (long)p_Var9) {
          p_Var10 = p_Var9;
        }
        if (((var_types->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)p_Var10 >> 6) +
              (ulong)(((ulong)p_Var9 & 0x800000000000003f) < 0x8000000000000001) +
              0xffffffffffffffff] >> ((ulong)p_Var9 & 0x3f) & 1) == 0) {
          dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)p_Var9];
          uVar7 = (ulong)dVar1;
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var9;
          variable_set::operator|=(&local_118,(variable *)&local_158);
        }
        p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
      } while (p_Var9 < (_Base_ptr)
                        ((long)(this->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var9 = (_Base_ptr)0x0;
      do {
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)order_score(this,&local_c8,(size_t)p_Var9,ord_type);
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)p_Var9;
        iVar8 = std::
                _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                ::_M_emplace_equal<std::pair<double,unsigned_long>>
                          ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                            *)&local_60,(pair<double,_unsigned_long> *)&local_158);
        local_b0.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var9]._M_node = iVar8._M_node;
        p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
      } while (p_Var9 < (_Base_ptr)
                        ((long)(this->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_vadj).
                               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_vadj).
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_160 = 0;
      do {
        p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          p_Var14 = &local_60._M_impl.super__Rb_tree_header._M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Rb_tree_node_base *)0x0) {
            p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (*(double *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1) <
                  *(double *)(p_Var10 + 1)) {
                p_Var14 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)
                        [*(double *)(p_Var10 + 1) <=
                         *(double *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1)];
            } while (p_Var10 != (_Base_ptr)0x0);
          }
          iVar4 = 0;
          p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          while (p_Var11 != p_Var14) {
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            iVar4 = iVar4 + 1;
          }
          if (iVar4 < 1) {
            __assert_fail("imax > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/util.h"
                          ,0x88,"int merlin::randi(int)");
          }
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = rand();
            iVar5 = (int)((double)iVar4 * ((double)iVar5 / 2147483647.0)) + 1;
            if (iVar4 <= iVar5) {
              iVar5 = iVar4;
            }
          }
          lVar16 = (long)iVar5;
          if (iVar5 < 1) {
            if (iVar5 != 0) {
              do {
                p_Var9 = (_Base_ptr)std::_Rb_tree_decrement(p_Var9);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0);
            }
          }
          else {
            do {
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
        }
        else {
          while( true ) {
            local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)p_Var9[1]._M_parent;
            dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(long)local_158.m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start];
            uVar7 = (ulong)dVar1;
            local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
            bVar3 = variable_set::contains(&local_118,(variable *)&local_158);
            if (bVar3) break;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          }
        }
        p_Var9 = p_Var9[1]._M_parent;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_start[local_160] = (unsigned_long)p_Var9;
        std::
        _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                            *)&local_60,
                           local_b0.
                           super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)p_Var9]._M_node);
        dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(long)p_Var9];
        uVar7 = (ulong)dVar1;
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)p_Var9;
        variable_set::operator/=(&local_118,(variable *)&local_158);
        variable_set::variable_set
                  (&local_158,
                   local_c8.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)p_Var9);
        local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.m_d = (vsize *)0x0;
        if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar16 = 0;
          do {
            lVar12 = *(long *)((_Rb_tree_color *)
                               local_158.m_v.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16 * 2);
            variable_set::operator|=
                      (local_c8.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar12,&local_158);
            dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)p_Var9];
            uVar7 = (ulong)dVar1;
            local_d8.second = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
            local_d8.first = (double)p_Var9;
            variable_set::operator/=
                      (local_c8.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar12,(variable *)&local_d8);
            if ((ulong)((long)local_98.m_v.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_98.m_v.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) <
                local_60._M_impl.super__Rb_tree_header._M_node_count) {
              variable_set::operator|=
                        (&local_98,
                         local_c8.
                         super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != (long)local_158.m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        if (local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar16 = 0;
          do {
            i = local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar16];
            std::
            _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
            ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                *)&local_60,
                               local_b0.
                               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[i]._M_node);
            local_d8.first = order_score(this,&local_c8,i,ord_type);
            local_d8.second = i;
            iVar8 = std::
                    _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    ::_M_emplace_equal<std::pair<double,unsigned_long>>
                              ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                *)&local_60,&local_d8);
            local_b0.
            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i]._M_node = iVar8._M_node;
            lVar16 = lVar16 + 1;
          } while (lVar16 != (long)local_98.m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_98.m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        variable_set::~variable_set(&local_98);
        variable_set::~variable_set(&local_158);
        local_160 = local_160 + 1;
      } while (local_160 <
               (ulong)((long)(this->m_vadj).
                             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_vadj).
                             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    variable_set::~variable_set(&local_118);
    if (local_b0.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

variable_order_t order(OrderMethod ord_type, std::vector<bool> var_types) const {
		variable_order_t order;
		order.resize(nvar());

		if (ord_type == OrderMethod::Random) {	// random orders are treated here
			variable_order_t sumOrd, maxOrd;
			for (size_t i = 0; i < nvar(); i++) {
				//   build a list of all the variables
				if (var_types[i] == true) maxOrd.push_back(var(i).label());
				else sumOrd.push_back(var(i).label());
			}

			std::random_shuffle(sumOrd.begin(), sumOrd.end());//   and randomly permute them
			std::random_shuffle(maxOrd.begin(), maxOrd.end());
			size_t i = 0;
			for (size_t j = 0; j < sumOrd.size(); ++j) order[i++] = sumOrd[j];
			for (size_t j = 0; j < maxOrd.size(); ++j) order[i++] = maxOrd[j];
			return order;											//   then return
		}

		std::vector<variable_set> adj = mrf();
		typedef std::pair<double, size_t> node_score_t;
		typedef std::multimap<double, size_t> score_map_t;
		score_map_t scores;
		std::vector<score_map_t::iterator> reverse(nvar());

		// get the sum and max variables
		variable_set sumVars;
		for (size_t v = 0; v < nvar(); ++v) {
			if (var_types[v] == false) sumVars |= var(v);
		}

		// get initial scores
		for (size_t v = 0; v < nvar(); ++v) {
			reverse[v] = scores.insert(node_score_t(order_score(adj, v, ord_type), v));
		}

		// Iterate through, selecting sum variables first
		for (size_t ii = 0; ii < nvar(); ++ii) {// Iterate through, selecting variables

			score_map_t::iterator first, last;
			if (sumVars.size() > 0) { // Choose a random entry from among the smallest sum vars
				for (score_map_t::iterator fi = scores.begin(); fi != scores.end(); ++fi) {
					variable v = var(fi->second);
					if (sumVars.contains(v)) {
						first = fi;
						last = scores.upper_bound(first->first);
						break;
					}
				}
			} else {
				first = scores.begin();// Choose a random entry from among the smallest
				last = scores.upper_bound(first->first);
				std::advance(first, randi(std::distance(first, last)));
			}
			size_t i = first->second;

			order[ii] = var(i).label(); // save its label in the ordering
			scores.erase(reverse[i]);	// remove it from our list
			sumVars /= var(i);
			variable_set vi = adj[i]; // go through adjacent variables (copy: adj may change)
			variable_set fix;					//   and keep track of which need updating
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				size_t v = _vindex(*j);
				adj[v] |= vi;             // and update their adjacency structures
				adj[v] /= var(i);
				if (fix.size() < scores.size()) {
					if (ord_type == OrderMethod::MinWidth
							|| ord_type == OrderMethod::WtMinWidth)
						fix |= adj[v]; //var(v);				// (width methods only need v, not nbrs)
					else
						fix |= adj[v];	// come back and recalculate their scores
				}
			}
			for (variable_set::const_iterator j = fix.begin(); j != fix.end(); ++j) {
				size_t jj = j->label();
				scores.erase(reverse[jj]);	// remove and update (score,index) pairs
				reverse[jj] = scores.insert(node_score_t(order_score(adj, jj, ord_type), jj));
			}
		}

		return order;
	}